

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QWellArray::paintEvent(QWellArray *this,QPaintEvent *e)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int c;
  int r;
  ulong uVar11;
  long in_FS_OFFSET;
  QPainter painter;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = *(int *)(e + 0x14);
  iVar5 = *(int *)(e + 0x18);
  iVar10 = *(int *)(e + 0x1c);
  iVar4 = columnAt(this,*(int *)(e + 0x10));
  iVar5 = columnAt(this,iVar5 + 1);
  uVar11 = (long)iVar8 / (long)this->cellh & 0xffffffff;
  iVar10 = (iVar10 + 1) / this->cellh;
  bVar3 = QWidget::isRightToLeft(&this->super_QWidget);
  iVar8 = iVar4;
  if (bVar3) {
    iVar8 = iVar5;
    iVar5 = iVar4;
  }
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_40,&(this->super_QWidget).super_QPaintDevice);
  local_58 = 0;
  iStack_54 = 0;
  uVar1 = this->cellw;
  uVar2 = this->cellh;
  iStack_50 = uVar1 + -1;
  iStack_4c = uVar2 + -1;
  iVar4 = this->ncols + -1;
  iVar9 = iVar4;
  if (iVar5 < this->ncols) {
    iVar9 = iVar5;
  }
  if (iVar5 < 0) {
    iVar9 = iVar4;
  }
  iVar5 = this->nrows + -1;
  iVar4 = iVar5;
  if (iVar10 < this->nrows) {
    iVar4 = iVar10;
  }
  if (iVar10 < 0) {
    iVar4 = iVar5;
  }
  while (iVar5 = (int)uVar11, iVar5 <= iVar4) {
    iVar6 = this->cellh * iVar5;
    for (iVar10 = iVar8; iVar10 <= iVar9; iVar10 = iVar10 + 1) {
      iVar7 = columnX(this,iVar10);
      local_58 = local_58 + iVar7;
      iStack_54 = iStack_54 + iVar6;
      iStack_50 = iStack_50 + iVar7;
      iStack_4c = iStack_4c + iVar6;
      (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this,&local_40,uVar11,iVar10,&local_58);
      local_58 = local_58 - iVar7;
      iStack_54 = iStack_54 - iVar6;
      iStack_50 = iStack_50 - iVar7;
      iStack_4c = iStack_4c - iVar6;
    }
    uVar11 = (ulong)(iVar5 + 1);
  }
  QPainter::~QPainter((QPainter *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWellArray::paintEvent(QPaintEvent *e)
{
    QRect r = e->rect();
    int cx = r.x();
    int cy = r.y();
    int ch = r.height();
    int cw = r.width();
    int colfirst = columnAt(cx);
    int collast = columnAt(cx + cw);
    int rowfirst = rowAt(cy);
    int rowlast = rowAt(cy + ch);

    if (isRightToLeft()) {
        int t = colfirst;
        colfirst = collast;
        collast = t;
    }

    QPainter painter(this);
    QPainter *p = &painter;
    QRect rect(0, 0, cellWidth(), cellHeight());


    if (collast < 0 || collast >= ncols)
        collast = ncols-1;
    if (rowlast < 0 || rowlast >= nrows)
        rowlast = nrows-1;

    // Go through the rows
    for (int r = rowfirst; r <= rowlast; ++r) {
        // get row position and height
        int rowp = rowY(r);

        // Go through the columns in the row r
        // if we know from where to where, go through [colfirst, collast],
        // else go through all of them
        for (int c = colfirst; c <= collast; ++c) {
            // get position and width of column c
            int colp = columnX(c);
            // Translate painter and draw the cell
            rect.translate(colp, rowp);
            paintCell(p, r, c, rect);
            rect.translate(-colp, -rowp);
        }
    }
}